

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prscomp.c
# Opt level: O2

prpnum prssynp(prscxdef *ctx,uchar *prefix,size_t pfxlen,uchar *suffix)

{
  char *nam;
  ushort uVar1;
  toktdef *ptVar2;
  tokdef tok;
  toksdef sym;
  
  uVar1 = *(ushort *)suffix;
  tok.toklen = (int)pfxlen + (int)((ulong)uVar1 - 2);
  nam = tok.toknam;
  memcpy(nam,prefix,pfxlen);
  memcpy(tok.toknam + pfxlen,suffix + 2,(ulong)uVar1 - 2);
  tok_case_fold(ctx->prscxtok,&tok);
  tok.toknam[tok.toklen] = '\0';
  tok.tokhash = tokhsh(nam);
  tok.toktyp = 0x38;
  ptVar2 = ctx->prscxstab;
  tok.toksym.tokstyp = '\0';
  (*ptVar2->toktfsea)(ptVar2,nam,tok.toklen,tok.tokhash,&tok.toksym);
  prsdef(ctx,&tok,3);
  (*ptVar2->toktfsea)(ptVar2,nam,tok.toklen,tok.tokhash,&sym);
  return sym.toksval;
}

Assistant:

static prpnum prssynp(prscxdef *ctx, uchar *prefix, size_t pfxlen,
                      uchar *suffix)
{
    tokdef   tok;
    toksdef  sym;
    size_t   suflen;
    toktdef *tab;
    
    /* construct the token */
    suflen = osrp2(suffix) - 2;
    suffix += 2;

    /* build the synonym */
    tok.toklen = pfxlen + suflen;
    memcpy(tok.toknam, prefix, pfxlen);
    memcpy(tok.toknam + pfxlen, suffix, suflen);

    /* fold case if we're in case-insensitive mode */
    tok_case_fold(ctx->prscxtok, &tok);

    /* build the token */
    tok.toknam[tok.toklen] = '\0';
    tok.tokhash = tokhsh(tok.toknam);
    tok.toktyp = TOKTSYMBOL;

    /* look up the symbol, if it's already in the table */
    tab = ctx->prscxstab;
    tok.toksym.tokstyp = TOKSTUNK;
    (*tab->toktfsea)(tab, tok.toknam, tok.toklen, tok.tokhash, &tok.toksym);

    /* make it a property if it's not already */
    prsdef(ctx, &tok, TOKSTPROP);
    
    /* now look it up and return its property number */
    (*tab->toktfsea)(tab, tok.toknam, tok.toklen, tok.tokhash, &sym);
    return(sym.toksval);
}